

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

torrent_state * __thiscall
libtorrent::aux::torrent::get_peer_list_state(torrent_state *__return_storage_ptr__,torrent *this)

{
  _func_int *p_Var1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  session_settings *this_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  external_ip local_90;
  undefined4 extraout_var_00;
  
  torrent_state::torrent_state(__return_storage_ptr__);
  bVar2 = is_finished(this);
  __return_storage_ptr__->is_finished = bVar2;
  iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2e])();
  bVar2 = session_settings::get_bool((session_settings *)CONCAT44(extraout_var,iVar3),0x8000);
  __return_storage_ptr__->allow_multiple_connections_per_ip = bVar2;
  p_Var1 = (((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
           [0x2e];
  if (((this->super_torrent_hot_members).field_0x4b & 0x18) == 0) {
    iVar3 = (*p_Var1)();
    this_00 = (session_settings *)CONCAT44(extraout_var_01,iVar3);
    iVar3 = 0x4035;
  }
  else {
    iVar3 = (*p_Var1)();
    this_00 = (session_settings *)CONCAT44(extraout_var_00,iVar3);
    iVar3 = 0x4036;
  }
  iVar3 = session_settings::get_int(this_00,iVar3);
  __return_storage_ptr__->max_peerlist_size = iVar3;
  iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2e])();
  iVar3 = session_settings::get_int((session_settings *)CONCAT44(extraout_var_02,iVar3),0x4010);
  __return_storage_ptr__->min_reconnect_time = iVar3;
  (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[3])
            (&local_90);
  external_ip::operator=(&__return_storage_ptr__->ip,&local_90);
  uVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x20])();
  __return_storage_ptr__->port = uVar4 & 0xffff;
  iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2e])();
  iVar3 = session_settings::get_int((session_settings *)CONCAT44(extraout_var_03,iVar3),0x400f);
  __return_storage_ptr__->max_failcount = iVar3;
  return __return_storage_ptr__;
}

Assistant:

torrent_state torrent::get_peer_list_state()
	{
		torrent_state ret;
		ret.is_finished = is_finished();
		ret.allow_multiple_connections_per_ip = settings().get_bool(settings_pack::allow_multiple_connections_per_ip);
		ret.max_peerlist_size = is_paused()
			? settings().get_int(settings_pack::max_paused_peerlist_size)
			: settings().get_int(settings_pack::max_peerlist_size);
		ret.min_reconnect_time = settings().get_int(settings_pack::min_reconnect_time);

		ret.ip = m_ses.external_address();
		ret.port = m_ses.listen_port();
		ret.max_failcount = settings().get_int(settings_pack::max_failcount);
		return ret;
	}